

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3FindDb(sqlite3 *db,Token *pName)

{
  int iVar1;
  char *zName_00;
  char *zName;
  int i;
  Token *pName_local;
  sqlite3 *db_local;
  
  zName_00 = sqlite3NameFromToken(db,pName);
  iVar1 = sqlite3FindDbName(db,zName_00);
  sqlite3DbFree(db,zName_00);
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3FindDb(sqlite3 *db, Token *pName){
  int i;                               /* Database number */
  char *zName;                         /* Name we are searching for */
  zName = sqlite3NameFromToken(db, pName);
  i = sqlite3FindDbName(db, zName);
  sqlite3DbFree(db, zName);
  return i;
}